

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_extension.cc
# Opt level: O3

bool __thiscall
anon_unknown.dwarf_6aa21::PyListCtrlPMatchSource<cpsm::FilenameOnlyMatch>::fill
          (PyListCtrlPMatchSource<cpsm::FilenameOnlyMatch> *this,
          vector<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          *items)

{
  pointer *ppPVar1;
  pointer pPVar2;
  pointer pPVar3;
  size_t sVar4;
  int iVar5;
  Obj p_Var6;
  char *pcVar7;
  ulong uVar8;
  pointer pPVar9;
  pointer pPVar10;
  long lVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  pointer pPVar15;
  ulong uVar16;
  bool bVar17;
  size_t local_38;
  
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)this);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
LAB_0012547b:
    std::__throw_length_error("vector::_M_realloc_insert");
  }
  if (this->done_ == false) {
    lVar14 = this->i_;
    lVar11 = this->size_;
    lVar12 = lVar14 + 0x200;
    if (lVar11 < lVar14 + 0x200) {
      lVar12 = lVar11;
    }
    if (lVar14 < lVar11) {
      do {
        p_Var6 = (Obj)PyList_GetItem(this->list_);
        if ((p_Var6 == (Obj)0x0) ||
           (pcVar7 = (char *)PyUnicode_AsUTF8AndSize(p_Var6,&local_38), sVar4 = local_38,
           pcVar7 == (char *)0x0)) {
          this->done_ = true;
          goto LAB_00125459;
        }
        pPVar2 = (items->
                 super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        if (pPVar2 == (items->
                      super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                      )._M_impl.super__Vector_impl_data._M_end_of_storage) {
          pPVar3 = (items->
                   super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                   )._M_impl.super__Vector_impl_data._M_start;
          lVar14 = (long)pPVar2 - (long)pPVar3;
          if (lVar14 == 0x7ffffffffffffff8) goto LAB_0012547b;
          uVar8 = (lVar14 >> 3) * -0x5555555555555555;
          uVar13 = uVar8;
          if (pPVar2 == pPVar3) {
            uVar13 = 1;
          }
          uVar16 = uVar13 + uVar8;
          if (0x555555555555554 < uVar16) {
            uVar16 = 0x555555555555555;
          }
          if (CARRY8(uVar13,uVar8)) {
            uVar16 = 0x555555555555555;
          }
          pPVar9 = (pointer)operator_new(uVar16 * 0x18);
          *(char **)((long)pPVar9 + lVar14) = pcVar7;
          *(size_t *)((long)pPVar9 + lVar14 + 8) = sVar4;
          *(Obj *)((long)pPVar9 + lVar14 + 0x10) = p_Var6;
          pPVar15 = pPVar9;
          for (pPVar10 = pPVar3; pPVar2 != pPVar10; pPVar10 = pPVar10 + 1) {
            pPVar15->obj = pPVar10->obj;
            sVar4 = (pPVar10->inner).inner.item_.len_;
            (pPVar15->inner).inner.item_.ptr_ = (pPVar10->inner).inner.item_.ptr_;
            *(size_t *)((long)&(pPVar15->inner).inner.item_ + 8) = sVar4;
            pPVar15 = pPVar15 + 1;
          }
          if (pPVar3 != (pointer)0x0) {
            operator_delete(pPVar3);
          }
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_start = pPVar9;
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_finish = pPVar15 + 1;
          (items->
          super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = pPVar9 + uVar16;
        }
        else {
          (pPVar2->inner).inner.item_.ptr_ = pcVar7;
          (pPVar2->inner).inner.item_.len_ = local_38;
          pPVar2->obj = p_Var6;
          ppPVar1 = &(items->
                     super__Vector_base<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>,_std::allocator<(anonymous_namespace)::PyObjItem<cpsm::CtrlPItem<cpsm::StringRefItem,_cpsm::FilenameOnlyMatch>,_false>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
          *ppPVar1 = *ppPVar1 + 1;
        }
        lVar14 = this->i_ + 1;
        this->i_ = lVar14;
      } while (lVar14 < lVar12);
      lVar11 = this->size_;
    }
    bVar17 = lVar14 != lVar11;
  }
  else {
LAB_00125459:
    bVar17 = false;
  }
  pthread_mutex_unlock((pthread_mutex_t *)this);
  return bVar17;
}

Assistant:

bool fill(std::vector<Item>& items) {
    std::lock_guard<std::mutex> lock(mu_);
    if (done_) {
      return false;
    }
    auto const add_item = [&](PyObject* item_obj) {
      if (item_obj == nullptr) {
        return false;
      }
      char* item_data;
      Py_ssize_t item_size;
      if (!PyVimString_AsStringAndSize(item_obj, &item_data, &item_size)) {
        return false;
      }
      items.emplace_back(
          cpsm::CtrlPItem<cpsm::StringRefItem, MatchMode>(
              (cpsm::StringRefItem(boost::string_ref(item_data, item_size)))),
          item_obj);
      return true;
    };
    Py_ssize_t const max = std::min(i_ + batch_size(), size_);
    for (; i_ < max; i_++) {
      if (!add_item(PyList_GetItem(list_, i_))) {
        done_ = true;
        return false;
      }
    }
    return i_ != size_;
  }